

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ext_channel_id_parse_serverhello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  int iVar1;
  bool bVar2;
  
  bVar2 = true;
  if (contents != (CBS *)0x0) {
    iVar1 = SSL_is_dtls(hs->ssl);
    if (iVar1 != 0) {
      __assert_fail("!SSL_is_dtls(hs->ssl)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x63d,
                    "bool bssl::ext_channel_id_parse_serverhello(SSL_HANDSHAKE *, uint8_t *, CBS *)"
                   );
    }
    if ((hs->config->channel_id_private)._M_t.
        super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl == (evp_pkey_st *)0x0) {
      __assert_fail("hs->config->channel_id_private",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x63e,
                    "bool bssl::ext_channel_id_parse_serverhello(SSL_HANDSHAKE *, uint8_t *, CBS *)"
                   );
    }
    if (contents->len == 0) {
      hs->field_0x6cb = hs->field_0x6cb | 1;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

static bool ext_channel_id_parse_serverhello(SSL_HANDSHAKE *hs,
                                             uint8_t *out_alert,
                                             CBS *contents) {
  if (contents == NULL) {
    return true;
  }

  assert(!SSL_is_dtls(hs->ssl));
  assert(hs->config->channel_id_private);

  if (CBS_len(contents) != 0) {
    return false;
  }

  hs->channel_id_negotiated = true;
  return true;
}